

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

uchar ** traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
                   (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node,uchar **dst,
                   size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  byte bVar1;
  ushort uVar2;
  vector_brodnik<unsigned_char_*> *this;
  size_t sVar3;
  size_t sVar4;
  pointer pppuVar5;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node_00;
  size_t __n;
  uchar **__dest;
  pointer pppuVar6;
  byte bVar7;
  pointer ppvVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  pointer pppuVar13;
  
  ppvVar8 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar8) {
    uVar11 = 0;
    do {
      this = (vector_brodnik<unsigned_char_*> *)ppvVar8[uVar11];
      if (((ulong)this & 1) == 0) {
        if (this != (vector_brodnik<unsigned_char_*> *)0x0) {
          bVar1 = this->_superblock;
          small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                       CONCAT71((int7)((ulong)small_sort >> 8),bVar1);
          uVar2 = this->_left_in_superblock;
          sVar3 = this->_block_size;
          sVar4 = this->_left_in_block;
          pppuVar13 = (this->_index_block).
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pppuVar5 = (this->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          __dest = dst;
          if (pppuVar5 != pppuVar13) {
            lVar12 = 8;
            pppuVar6 = (pointer)0x0;
            lVar9 = 8;
            bVar7 = 0;
            do {
              if (lVar9 != 0) {
                lVar10 = lVar9;
                pppuVar13 = pppuVar6;
                do {
                  small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                               (this->_index_block).
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                  pppuVar5 = (this->_index_block).
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  if (pppuVar13 == (pointer)(((long)pppuVar5 - (long)small_sort >> 3) + -1))
                  goto LAB_001a97a0;
                  if (lVar12 != 0) {
                    memmove(__dest,*(pointer)((long)small_sort + pppuVar13 * 8),lVar12 * 8);
                  }
                  pppuVar13 = (pointer)((long)pppuVar13 + 1);
                  __dest = __dest + lVar12;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
                pppuVar13 = (this->_index_block).
                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                pppuVar5 = (this->_index_block).
                           super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
              }
              pppuVar6 = (pointer)((long)pppuVar6 + lVar9);
              lVar9 = lVar9 << bVar7;
              bVar7 = bVar7 ^ 1;
              lVar12 = lVar12 << bVar7;
              small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                           ((long)pppuVar5 - (long)pppuVar13 >> 3);
            } while (pppuVar6 < small_sort);
          }
LAB_001a97a0:
          __n = (long)this->_insertpos - (long)pppuVar5[-1];
          if (__n != 0) {
            memmove(__dest,pppuVar5[-1],__n);
          }
          lVar9 = ((long)(2 << (bVar1 & 0x1f)) - (uVar2 * sVar3 + sVar4)) + -0x40;
          if ((char)uVar11 != '\0') {
            mkqsort(dst,(int)lVar9,(int)depth);
          }
          dst = dst + lVar9;
          vector_brodnik<unsigned_char_*>::~vector_brodnik(this);
          operator_delete(this);
        }
      }
      else {
        node_00 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node
                            (node,(uint)uVar11);
        dst = traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
                        (node_00,dst,depth + 1,small_sort);
      }
      uVar11 = (ulong)((uint)uVar11 + 1);
      ppvVar8 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(node->_buckets).
                                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppvVar8 >> 3));
  }
  if (ppvVar8 != (pointer)0x0) {
    operator_delete(ppvVar8);
  }
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}